

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_Test::
TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_Test
          (TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_Test *this)

{
  TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_Test *this_local;
  
  memset(this,0,0x70);
  TEST_GROUP_CppUTestGroupFailableMemoryAllocator::TEST_GROUP_CppUTestGroupFailableMemoryAllocator
            (&this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator);
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_Test_0040c738
  ;
  return;
}

Assistant:

TEST(FailableMemoryAllocator, FailThirdAllocationAtGivenLine)
{
    int *memory[10] = { NULLPTR };
    int allocation;
    failableMallocAllocator->failNthAllocAt(3, __FILE__, __LINE__ + 4);

    for (allocation = 1; allocation <= 10; allocation++)
    {
        memory[allocation - 1] = (int *)malloc(sizeof(int));
        if (memory[allocation - 1] == NULLPTR)
            break;
        free(memory[allocation -1]);
    }

    LONGS_EQUAL(3, allocation);
}